

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  ImGuiDockNode *pIVar6;
  uint *puVar7;
  ImGuiDockNode *pIVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  
  pIVar6 = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  uVar2 = src_node->SharedFlags;
  pIVar6->SharedFlags = uVar2;
  uVar3 = src_node->LocalFlags;
  pIVar6->LocalFlags = uVar3;
  pIVar6->LocalFlagsInWindows = 0;
  pIVar6->Pos = src_node->Pos;
  pIVar6->Size = src_node->Size;
  pIVar6->SizeRef = src_node->SizeRef;
  pIVar6->SplitAxis = src_node->SplitAxis;
  pIVar6->MergedFlags = uVar3 | uVar2;
  iVar10 = out_node_remap_pairs->Size;
  if (iVar10 == out_node_remap_pairs->Capacity) {
    if (iVar10 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar10 / 2 + iVar10;
    }
    iVar12 = iVar10 + 1;
    if (iVar10 + 1 < iVar9) {
      iVar12 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    puVar7 = (uint *)(*GImAllocatorAllocFunc)((long)iVar12 << 2,GImAllocatorUserData);
    if (out_node_remap_pairs->Data != (uint *)0x0) {
      memcpy(puVar7,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
      puVar4 = out_node_remap_pairs->Data;
      if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
    }
    out_node_remap_pairs->Data = puVar7;
    out_node_remap_pairs->Capacity = iVar12;
    iVar10 = out_node_remap_pairs->Size;
  }
  else {
    puVar7 = out_node_remap_pairs->Data;
  }
  puVar7[iVar10] = src_node->ID;
  iVar9 = out_node_remap_pairs->Size;
  iVar10 = iVar9 + 1;
  out_node_remap_pairs->Size = iVar10;
  if (iVar10 == out_node_remap_pairs->Capacity) {
    iVar9 = iVar9 + 2;
    if (iVar10 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar10 / 2 + iVar10;
    }
    if (iVar9 < iVar10) {
      iVar9 = iVar10;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    puVar7 = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    if (out_node_remap_pairs->Data != (uint *)0x0) {
      memcpy(puVar7,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
      puVar4 = out_node_remap_pairs->Data;
      if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
    }
    out_node_remap_pairs->Data = puVar7;
    out_node_remap_pairs->Capacity = iVar9;
    iVar10 = out_node_remap_pairs->Size;
  }
  else {
    puVar7 = out_node_remap_pairs->Data;
  }
  puVar7[iVar10] = pIVar6->ID;
  out_node_remap_pairs->Size = out_node_remap_pairs->Size + 1;
  lVar13 = 0;
  bVar5 = true;
  do {
    bVar11 = bVar5;
    if (src_node->ChildNodes[lVar13] != (ImGuiDockNode *)0x0) {
      pIVar8 = DockBuilderCopyNodeRec(src_node->ChildNodes[lVar13],0,out_node_remap_pairs);
      pIVar6->ChildNodes[lVar13] = pIVar8;
      pIVar8->ParentNode = pIVar6;
    }
    lVar13 = 1;
    bVar5 = false;
  } while (bVar11);
  return pIVar6;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->UpdateMergedFlags();

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}